

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

int StringHold(Situation *s)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  UINT8 *pUVar14;
  ulong uVar15;
  ulong uVar16;
  int string_value [2];
  int local_50 [2];
  UINT8 *local_48;
  long local_40;
  ulong local_38;
  
  pUVar14 = s->current_pieces + 0x27;
  lVar8 = 0;
  do {
    local_50[lVar8] = 0;
    lVar4 = lVar8 * -0x10;
    uVar13 = (int)lVar4 + 0x20;
    local_38 = lVar8 * 0x10 + 0x10;
    iVar10 = 1 - (int)lVar8;
    local_48 = (UINT8 *)0x7;
    do {
      bVar1 = s->current_pieces[(ulong)local_48 | local_38];
      if (bVar1 != 0) {
        bVar2 = *(byte *)((long)s + lVar4 + 0x124);
        if (bVar2 != 0) {
          uVar6 = bVar1 & 0xf;
          bVar3 = bVar1 >> 4;
          uVar11 = bVar2 & 0xf;
          if (uVar6 == uVar11) {
            lVar12 = (ulong)bVar3 - 3;
            if (bVar2 >> 4 ==
                ROOK_CANNON_CAN_GET_COL[lVar12][s->bit_col[uVar6]].cannon_capture[bVar2 <= bVar1]) {
              uVar9 = (ulong)((uint)ROOK_CANNON_CAN_GET_COL[lVar12][s->bit_col[uVar6]].rook_capture
                                    [bVar2 <= bVar1] << 4 | uVar6);
LAB_0010cca5:
              if (((uVar13 & s->current_board[uVar9]) != 0) &&
                 ((0x66006600000U >> ((ulong)s->current_board[uVar9] & 0x3f) & 1) != 0)) {
                bVar5 = IfProtected(iVar10,(int)uVar9,s,(uint)bVar2);
                if (!bVar5) {
                  local_50[lVar8] = local_50[lVar8] + (int)""[(int)((bVar2 | 0x100) - (int)uVar9)];
                }
              }
            }
          }
          else if (bVar3 == bVar2 >> 4) {
            if (uVar11 == ROOK_CANNON_CAN_GET_ROW[(ulong)uVar6 - 3][s->bit_col[bVar3]].
                          cannon_capture[bVar2 <= bVar1]) {
              uVar9 = (ulong)ROOK_CANNON_CAN_GET_ROW[(ulong)uVar6 - 3][s->bit_col[bVar3]].
                             rook_capture[bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
              goto LAB_0010cca5;
            }
          }
        }
        uVar6 = bVar1 & 0xf;
        uVar9 = (ulong)uVar6;
        bVar2 = bVar1 >> 4;
        local_40 = uVar9 - 3;
        iVar7 = bVar2 - 3;
        lVar12 = 0;
        do {
          bVar3 = pUVar14[lVar12];
          if (bVar3 != 0) {
            uVar11 = bVar3 & 0xf;
            if (uVar6 == uVar11) {
              if (bVar3 >> 4 ==
                  ROOK_CANNON_CAN_GET_COL[iVar7][s->bit_col[uVar9]].cannon_capture[bVar3 <= bVar1])
              {
                uVar15 = (ulong)ROOK_CANNON_CAN_GET_COL[iVar7][s->bit_col[uVar9]].rook_capture
                                [bVar3 <= bVar1] << 4 | uVar9;
LAB_0010cde2:
                if (((uVar13 & s->current_board[uVar15]) != 0) &&
                   ((0x66006600000U >> ((ulong)s->current_board[uVar15] & 0x3f) & 1) != 0)) {
                  bVar5 = IfProtected(iVar10,(uint)bVar3,s,0);
                  if (!bVar5) {
                    bVar5 = IfProtected(iVar10,(int)uVar15,s,(uint)bVar3);
                    if (!bVar5) {
                      local_50[lVar8] =
                           local_50[lVar8] + (int)""[(int)((bVar3 | 0x100) - (int)uVar15)];
                    }
                  }
                }
              }
            }
            else if ((uint)bVar2 == (uint)(bVar3 >> 4)) {
              if (uVar11 == ROOK_CANNON_CAN_GET_ROW[local_40][s->bit_col[bVar2]].cannon_capture
                            [bVar3 <= bVar1]) {
                uVar15 = (ulong)ROOK_CANNON_CAN_GET_ROW[local_40][s->bit_col[bVar2]].rook_capture
                                [bVar3 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
                goto LAB_0010cde2;
              }
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 2);
      }
      local_48 = (UINT8 *)((long)local_48 + 1);
    } while (local_48 != (UINT8 *)0x9);
    iVar10 = 1 - (int)lVar8;
    uVar9 = 9;
    local_48 = pUVar14;
    do {
      bVar1 = s->current_pieces[uVar9 | local_38];
      if (bVar1 != 0) {
        bVar2 = *(byte *)((long)s + lVar4 + 0x124);
        if (bVar2 != 0) {
          uVar6 = bVar1 & 0xf;
          bVar3 = bVar1 >> 4;
          uVar11 = bVar2 & 0xf;
          if (uVar6 == uVar11) {
            lVar12 = (ulong)bVar3 - 3;
            if (bVar2 >> 4 ==
                ROOK_CANNON_CAN_GET_COL[lVar12][s->bit_col[uVar6]].supercannon_capture
                [bVar2 <= bVar1]) {
              uVar15 = (ulong)((uint)ROOK_CANNON_CAN_GET_COL[lVar12][s->bit_col[uVar6]].
                                     cannon_capture[bVar2 <= bVar1] << 4 | uVar6);
LAB_0010cf95:
              if (((uVar13 & s->current_board[uVar15]) != 0) &&
                 ((0x66006600000U >> ((ulong)s->current_board[uVar15] & 0x3f) & 1) != 0)) {
                bVar5 = IfProtected(iVar10,(int)uVar15,s,(uint)bVar2);
                if (!bVar5) {
                  local_50[lVar8] = local_50[lVar8] + (int)""[(int)((bVar2 | 0x100) - (int)uVar15)];
                }
              }
            }
          }
          else if (bVar3 == bVar2 >> 4) {
            if (uVar11 == ROOK_CANNON_CAN_GET_ROW[(ulong)uVar6 - 3][s->bit_col[bVar3]].
                          supercannon_capture[bVar2 <= bVar1]) {
              uVar15 = (ulong)ROOK_CANNON_CAN_GET_ROW[(ulong)uVar6 - 3][s->bit_col[bVar3]].
                              cannon_capture[bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
              goto LAB_0010cf95;
            }
          }
        }
        uVar6 = bVar1 & 0xf;
        uVar15 = (ulong)uVar6;
        bVar2 = bVar1 >> 4;
        local_40 = (long)(int)(bVar2 - 3);
        lVar12 = 0;
        do {
          bVar3 = pUVar14[lVar12];
          if (bVar3 != 0) {
            uVar11 = bVar3 & 0xf;
            if (uVar6 == uVar11) {
              if (bVar3 >> 4 ==
                  ROOK_CANNON_CAN_GET_COL[local_40][s->bit_col[uVar15]].supercannon_capture
                  [bVar3 <= bVar1]) {
                uVar16 = (ulong)ROOK_CANNON_CAN_GET_COL[local_40][s->bit_col[uVar15]].cannon_capture
                                [bVar3 <= bVar1] << 4 | uVar15;
LAB_0010d0c5:
                if (((uVar13 & s->current_board[uVar16]) != 0) &&
                   ((0x66006600000U >> ((ulong)s->current_board[uVar16] & 0x3f) & 1) != 0)) {
                  bVar5 = IfProtected(iVar10,(int)uVar16,s,(uint)bVar3);
                  pUVar14 = local_48;
                  if (!bVar5) {
                    local_50[lVar8] =
                         local_50[lVar8] + (int)""[(int)((bVar3 | 0x100) - (int)uVar16)];
                  }
                }
              }
            }
            else if ((uint)bVar2 == (uint)(bVar3 >> 4)) {
              if (uVar11 == ROOK_CANNON_CAN_GET_ROW[uVar15 - 3][s->bit_col[bVar2]].
                            supercannon_capture[bVar3 <= bVar1]) {
                uVar16 = (ulong)ROOK_CANNON_CAN_GET_ROW[uVar15 - 3][s->bit_col[bVar2]].
                                cannon_capture[bVar3 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
                goto LAB_0010d0c5;
              }
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 2);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0xb);
    pUVar14 = pUVar14 + -0x10;
    bVar5 = lVar8 != 0;
    lVar8 = lVar8 + 1;
    if (bVar5) {
      iVar10 = -(local_50[0] - local_50[1]);
      if (s->current_player == 0) {
        iVar10 = local_50[0] - local_50[1];
      }
      return iVar10;
    }
  } while( true );
}

Assistant:

int StringHold(Situation &s)
{
    int dir, pos_from, pos_to, pos_str;
    int x, y, side_tag, opp_side_tag;
    int string_value[2];

    for (int r = 0; r < 2; r++)
    {
        string_value[r] = 0;
        side_tag = 16 + (r << 4);
        opp_side_tag = 32 - (r << 4);
        //考察用車牵制的情况
        for (int i = 7; i <= 8; i++)
        {
            pos_from = s.current_pieces[side_tag + i];
            if (pos_from)
            {
                //考察牵制目标是帅(将)的情况
                pos_to = s.current_pieces[opp_side_tag];
                if (pos_to)
                {
                    x = GetCol(pos_from);
                    y = GetRow(pos_from);
                    if (x == GetCol(pos_to)) //纵向牵制
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        // 如果车用炮的吃法(炮用超级炮的着法)能吃到目标子"sqDst"，牵制就成立了，下同
                        int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir];
                        if (capture_row == GetRow(pos_to))
                        {
                            pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].rook_capture[dir] << 4); //计算被牵制的子位置，是车(炮)本身能吃到的棋子
                            if (s.current_board[pos_str] & opp_side_tag)                                         //被牵制子必须是对方的子
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to)) // 如果被牵制子是有价值的，而且被牵制子没有保护(被目标子保护不算)，那么牵制是有价值的
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                    else if (y == GetRow(pos_to)) //横向牵制
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                        if (capture_col == GetCol(pos_to))
                        {
                            pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].rook_capture[dir];
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                }

                // 考查牵制目标是车的情况
                for (int i = 7; i <= 8; i++)
                {
                    pos_to = s.current_pieces[opp_side_tag + i];
                    if (pos_to)
                    {
                        x = GetCol(pos_from);
                        y = GetRow(pos_from);
                        if (x == GetCol(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir];
                            if (capture_row == GetRow(pos_to))
                            {
                                pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].rook_capture[dir] << 4);
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_to, s) && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                        else if (y == GetRow(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                            if (capture_col == GetCol(pos_to))
                            {
                                pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].rook_capture[dir];
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_to, s) && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }

        // 考查用炮来牵制的情况
        for (int i = 9; i <= 10; i++)
        {
            pos_from = s.current_pieces[side_tag + i];
            if (pos_from)
            {
                //考察牵制目标是帅(将)的情况
                pos_to = s.current_pieces[opp_side_tag];
                if (pos_to)
                {
                    x = GetCol(pos_from);
                    y = GetRow(pos_from);
                    if (x == GetCol(pos_to))
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].supercannon_capture[dir];
                        if (capture_row == GetRow(pos_to))
                        {
                            pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir] << 4);
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                    else if (y == GetRow(pos_to))
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].supercannon_capture[dir];
                        if (capture_col == GetCol(pos_to))
                        {
                            pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                }

                // 考查牵制目标是车的情况
                for (int i = 7; i <= 8; i++)
                {
                    pos_to = s.current_pieces[opp_side_tag + i];
                    if (pos_to)
                    {
                        x = GetCol(pos_from);
                        y = GetRow(pos_from);
                        if (x == GetCol(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].supercannon_capture[dir];
                            if (capture_row == GetRow(pos_to))
                            {
                                pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir] << 4);
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                        else if (y == GetRow(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].supercannon_capture[dir];
                            if (capture_col == GetCol(pos_to))
                            {
                                pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return SideValue(s.current_player, string_value[RED] - string_value[BLACK]);
}